

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSA.cpp
# Opt level: O2

void __thiscall Storage::Disk::MSA::MSA(MSA *this,string *file_name)

{
  FileHolder *this_00;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  long lVar4;
  long lVar5;
  undefined4 *puVar6;
  size_t in_RCX;
  short sVar7;
  ushort uVar8;
  uint8_t value;
  uint8_t byte;
  MSA *local_68;
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> track;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__MSA_0058e790;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  local_60 = (vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->uncompressed_tracks_;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = FileHolder::get16be(this_00);
  if (uVar2 == 0xe0f) {
    uVar2 = FileHolder::get16be(this_00);
    this->sectors_per_track_ = uVar2;
    uVar2 = FileHolder::get16be(this_00);
    this->sides_ = uVar2 + 1;
    uVar2 = FileHolder::get16be(this_00);
    this->starting_track_ = uVar2;
    uVar2 = FileHolder::get16be(this_00);
    this->ending_track_ = uVar2;
    local_68 = this;
    while( true ) {
      uVar2 = FileHolder::get16be(this_00);
      bVar1 = FileHolder::eof(this_00);
      if (bVar1) break;
      if ((uint)local_68->sectors_per_track_ << 9 == (uint)uVar2) {
        FileHolder::read((FileHolder *)&track,(int)this_00,(void *)(ulong)uVar2,in_RCX);
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>(local_60,&track);
      }
      else {
        lVar4 = FileHolder::tell(this_00);
        track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&track,(ulong)local_68->sectors_per_track_ << 9);
        uVar8 = 0;
        while (uVar8 < uVar2) {
          byte = FileHolder::get8(this_00);
          if (byte == 0xe5) {
            uVar8 = uVar8 + 4;
            if (uVar2 < uVar8) break;
            value = FileHolder::get8(this_00);
            uVar3 = FileHolder::get16be(this_00);
            sVar7 = uVar3 + 1;
            while (sVar7 = sVar7 + -1, sVar7 != 0) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&track,&value);
            }
          }
          else {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&track,&byte);
            uVar8 = uVar8 + 1;
          }
        }
        lVar5 = FileHolder::tell(this_00);
        if (lVar5 - lVar4 != (ulong)uVar8) {
          __assert_fail("file_.tell() - start_of_track == pointer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/MSA.cpp"
                        ,0x41,"Storage::Disk::MSA::MSA(const std::string &)");
        }
        if ((uVar8 != uVar2) ||
           (in_RCX = (ulong)local_68->sectors_per_track_ * 0x200,
           (long)track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start != in_RCX)) {
          puVar6 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar6 = 0xfffffffe;
          __cxa_throw(puVar6,&Error::typeinfo,0);
        }
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>(local_60,&track);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&track);
    }
    if (((long)(local_68->uncompressed_tracks_).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(local_68->uncompressed_tracks_).
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 ==
        (long)(int)((uint)local_68->sides_ *
                   (((uint)local_68->ending_track_ - (uint)local_68->starting_track_) + 1))) {
      return;
    }
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0xfffffffe;
  __cxa_throw(puVar6,&Error::typeinfo,0);
}

Assistant:

MSA::MSA(const std::string &file_name) :
	file_(file_name) {
	const auto signature = file_.get16be();
	if(signature != 0x0e0f) throw Error::InvalidFormat;

	sectors_per_track_ = file_.get16be();
	sides_ = 1 + file_.get16be();
	starting_track_ = file_.get16be();
	ending_track_ = file_.get16be();

	// Create the uncompressed track list.
	while(true) {
		const auto data_length = file_.get16be();
		if(file_.eof()) break;

		if(data_length == sectors_per_track_ * 512) {
			// This is an uncompressed track.
			uncompressed_tracks_.push_back(file_.read(data_length));
		} else {
#ifndef NDEBUG
			const auto start_of_track = file_.tell();
#endif
			// This is an RLE-compressed track.
			std::vector<uint8_t> track;
			track.reserve(sectors_per_track_ * 512);
			uint16_t pointer = 0;
			while(pointer < data_length) {
				const auto byte = file_.get8();

				// Compression scheme: if the byte E5 is encountered, an RLE run follows.
				// An RLE run is encoded as the byte to repeat plus a 16-bit repeat count.
				if(byte != 0xe5) {
					track.push_back(byte);
					++pointer;
					continue;
				}

				pointer += 4;
				if(pointer > data_length) break;

				const auto value = file_.get8();
				auto count = file_.get16be();
				while(count--) {
					track.push_back(value);
				}
			}

#ifndef NDEBUG
			assert(file_.tell() - start_of_track == pointer);
#endif

			if(pointer != data_length || track.size() != sectors_per_track_ * 512)
				throw Error::InvalidFormat;
			uncompressed_tracks_.push_back(std::move(track));
		}
	}

	if(uncompressed_tracks_.size() != size_t((ending_track_ - starting_track_ + 1)*sides_))
		throw Error::InvalidFormat;
}